

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_extrude.cpp
# Opt level: O1

int ON_BrepExtrudeFace(ON_Brep *brep,int face_index,ON_Curve *path_curve,bool bCap)

{
  uint uVar1;
  int iVar2;
  ON_BrepFace *pOVar3;
  ON_BrepLoop *pOVar4;
  ON_3dVector path_vector_00;
  ON_3dVector path_vector_01;
  bool bVar5;
  int iVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  long lVar15;
  ON_SimpleArray<int> side_face_index;
  ON_SimpleArray<int> side_face_index_loop_mark;
  ON_3dVector path_vector;
  uint local_a8;
  int local_a4;
  int local_94;
  ON_SimpleArray<int> local_90;
  ON_BrepFace *local_78;
  ON_SimpleArray<int> local_70;
  long local_58;
  ON_Curve *local_50;
  ON_3dVector local_48;
  
  ON_Brep::DestroyMesh(brep,any_mesh);
  ON_Brep::DestroyRegionTopology(brep);
  uVar14 = 0;
  if ((-1 < face_index) &&
     (uVar14 = 0,
     face_index <
     (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count)) {
    pOVar3 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
    uVar1 = pOVar3[(uint)face_index].m_li.m_count;
    uVar12 = (ulong)uVar1;
    if (0 < (int)uVar1) {
      if (uVar1 == 1) {
        iVar6 = ON_BrepExtrudeLoop(brep,*pOVar3[(uint)face_index].m_li.m_a,path_curve,bCap);
        return iVar6;
      }
      local_90._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
      local_90.m_a = (int *)0x0;
      local_90.m_count = 0;
      local_90.m_capacity = 0;
      local_70._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
      local_70.m_a = (int *)0x0;
      local_70.m_count = 0;
      local_70.m_capacity = 0;
      local_50 = path_curve;
      bVar5 = ON_BrepExtrudeHelper_CheckPathCurve(path_curve,&local_48);
      uVar14 = 0;
      if (bVar5) {
        local_58 = (long)(brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                         super_ON_ClassArray<ON_BrepFace>.m_count;
        pOVar4 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
        uVar14 = 0;
        uVar9 = 0;
        uVar11 = 0;
        do {
          iVar6 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a
                  [(uint)face_index].m_li.m_a[uVar9];
          lVar10 = (long)iVar6;
          if ((lVar10 < 0) ||
             ((brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count
              <= iVar6)) goto LAB_00406126;
          if (pOVar4[lVar10].m_type - outer < 2) {
            uVar11 = uVar11 + pOVar4[lVar10].m_ti.m_count;
          }
          uVar9 = uVar9 + 1;
        } while (uVar12 != uVar9);
        if (uVar11 != 0) {
          ON_BrepExtrudeHelper_ReserveSpace(brep,uVar11,(uint)bCap);
          if ((uint)local_90.m_capacity < uVar11) {
            ON_SimpleArray<int>::SetCapacity(&local_90,(long)(int)uVar11);
          }
          if ((uint)local_70.m_capacity < uVar1) {
            ON_SimpleArray<int>::SetCapacity(&local_70,uVar12);
          }
          local_78 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                     m_a + (uint)face_index;
          local_a4 = -1;
          uVar9 = 0;
          local_a8 = 0xffffffff;
          bVar8 = bCap;
          do {
            local_94 = local_90.m_count;
            ON_SimpleArray<int>::Append(&local_70,&local_94);
            uVar11 = (local_78->m_li).m_a[uVar9];
            lVar10 = (long)(int)uVar11;
            uVar14 = 1;
            if ((-1 < lVar10) &&
               ((brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
                [lVar10].m_type - outer < 2)) {
              bVar7 = 0;
              if ((int)local_a8 < 0) {
                bVar7 = bVar8;
              }
              bVar13 = bCap & (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                              super_ON_ClassArray<ON_BrepLoop>.m_a[lVar10].m_type == outer;
              bCap = (bool)bVar8;
              if (bVar13 != 0) {
                bCap = (bool)bVar7;
              }
              bVar5 = ON_BrepExtrudeHelper_MakeSides
                                (brep,uVar11,local_50,(bool)(bCap & 1),&local_90);
              iVar6 = local_a4;
              uVar14 = local_a8;
              if ((int)local_a8 < 0) {
                iVar6 = (int)uVar9;
                uVar14 = uVar11;
              }
              if (bVar13 != 0) {
                local_a8 = uVar14;
                local_a4 = iVar6;
              }
              uVar14 = (uint)bVar5;
              bVar8 = bCap;
            }
            uVar9 = uVar9 + 1;
          } while ((uVar9 < uVar12) && (uVar14 != 0));
          if ((uVar14 != 0) && (((bCap & 1U) != 0 && (-1 < (int)local_a8)))) {
            iVar6 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                    m_count;
            path_vector_00.y = local_48.y;
            path_vector_00.x = local_48.x;
            path_vector_00.z = local_48.z;
            bVar5 = ON_BrepExtrudeHelper_MakeCap
                              (brep,local_a8,path_vector_00,local_90.m_a + local_70.m_a[local_a4]);
            uVar14 = 1;
            if ((bVar5) &&
               (iVar2 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                        super_ON_ClassArray<ON_BrepFace>.m_count, iVar6 < iVar2)) {
              pOVar3 = (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                       super_ON_ClassArray<ON_BrepFace>.m_a;
              uVar12 = 1;
              if (1 < (int)uVar1) {
                uVar12 = (ulong)uVar1;
              }
              uVar9 = 0;
              do {
                uVar14 = (local_78->m_li).m_a[uVar9];
                if (((uVar14 != local_a8 && -1 < (int)uVar14) &&
                    ((brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                     m_a[uVar14].m_type - outer < 2)) &&
                   (path_vector_01.y = local_48.y, path_vector_01.x = local_48.x,
                   path_vector_01.z = local_48.z,
                   bVar5 = ON_BrepExtrudeHelper_MakeTopLoop
                                     (brep,pOVar3 + (long)iVar2 + -1,uVar14,path_vector_01,
                                      local_90.m_a + local_70.m_a[uVar9]), bVar5)) {
                  pOVar4 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                           super_ON_ClassArray<ON_BrepLoop>.m_a;
                  pOVar4[(long)(brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                               super_ON_ClassArray<ON_BrepLoop>.m_count + -1].m_type =
                       pOVar4[uVar14].m_type;
                }
                uVar9 = uVar9 + 1;
              } while (uVar12 != uVar9);
              uVar14 = 2;
            }
          }
          if (((brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a
               [(uint)face_index].m_bRev == true) &&
             ((int)local_58 <
              (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count
             )) {
            lVar15 = local_58 * 0xd8;
            lVar10 = local_58;
            do {
              ON_Brep::FlipFace(brep,(ON_BrepFace *)
                                     ((((brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                                        super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                                     lVar15 + -0x5c));
              lVar10 = lVar10 + 1;
              lVar15 = lVar15 + 0xd8;
            } while (lVar10 < (brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                              super_ON_ClassArray<ON_BrepFace>.m_count);
          }
        }
      }
LAB_00406126:
      ON_SimpleArray<int>::~ON_SimpleArray(&local_70);
      ON_SimpleArray<int>::~ON_SimpleArray(&local_90);
    }
  }
  return uVar14;
}

Assistant:

int ON_BrepExtrudeFace( 
          ON_Brep& brep,
          int face_index,
          const ON_Curve& path_curve,
          bool bCap
          )
{
  int rc = 0; // returns 1 for success with no cap, 2 for success with a cap

  brep.DestroyMesh(ON::any_mesh);
  brep.DestroyRegionTopology();

  if ( face_index < 0 || face_index >= brep.m_F.Count() )
    return false;

  const int face_loop_count = brep.m_F[face_index].m_li.Count();
  if ( face_loop_count < 1 )
    return false;


  if ( brep.m_F[face_index].m_li.Count() == 1 )
  {
    rc = ON_BrepExtrudeLoop( brep, brep.m_F[face_index].m_li[0], path_curve, bCap );
  }
  else
  {
    ON_3dVector path_vector;
    ON_SimpleArray<int> side_face_index;
    ON_SimpleArray<int> side_face_index_loop_mark;
    int li, fli;

    if ( !ON_BrepExtrudeHelper_CheckPathCurve( path_curve, path_vector ) )
      return 0;

    //const int trim_count0 = brep.m_T.Count();
    const int loop_count0 = brep.m_L.Count();
    const int face_count0 = brep.m_F.Count();

    // count number of new objects so we can grow arrays
    // efficiently and use refs to dynamic array elements.
    int new_side_trim_count = 0;
    for ( fli = 0; fli < face_loop_count; fli++ )
    {
      li = brep.m_F[face_index].m_li[fli];
      if ( li < 0 || li >= loop_count0 )
        return false;
      if ( !ON_BrepExtrudeHelper_CheckLoop( brep, li ) )
        continue;
      new_side_trim_count += brep.m_L[li].m_ti.Count();
    }
    if ( new_side_trim_count == 0 )
      return false;
    ON_BrepExtrudeHelper_ReserveSpace( brep, new_side_trim_count, bCap?1:0 );

    side_face_index.Reserve(new_side_trim_count);
    side_face_index_loop_mark.Reserve(face_loop_count);

    const ON_BrepFace& face = brep.m_F[face_index];
  
    rc = true;
    int outer_loop_index = -1;
    int outer_fli = -1;
    for ( fli = 0; fli < face_loop_count && rc; fli++ )
    {
      side_face_index_loop_mark.Append( side_face_index.Count() );
      li = face.m_li[fli];
      if ( !ON_BrepExtrudeHelper_CheckLoop( brep, li ) )
        continue;
      ON_BrepLoop& loop = brep.m_L[li];
      if ( bCap && loop.m_type == ON_BrepLoop::outer )
      {
        if ( outer_loop_index >= 0 )
          bCap = false;
        else 
        {
          outer_loop_index = li;
          outer_fli = fli;
        }
      }
      rc = ON_BrepExtrudeHelper_MakeSides( brep, li, path_curve, bCap, side_face_index );
    }

    if ( bCap && rc && outer_loop_index >= 0 )
    {
      const int face_count1 = brep.m_F.Count();
      bCap = ON_BrepExtrudeHelper_MakeCap( 
                  brep, 
                  outer_loop_index, 
                  path_vector, 
                  side_face_index.Array() + side_face_index_loop_mark[outer_fli] );
      if ( bCap && brep.m_F.Count() > face_count1)
      {
        // put inner bondaries on the cap
        rc = 2;

        ON_BrepFace& cap_face = brep.m_F[brep.m_F.Count()-1];
        for ( fli = 0; fli < face_loop_count && rc; fli++ )
        {
          li = face.m_li[fli];
          if ( li == outer_loop_index )
            continue;
          if ( !ON_BrepExtrudeHelper_CheckLoop( brep, li ) )
            continue;
          if ( ON_BrepExtrudeHelper_MakeTopLoop( 
                      brep, 
                      cap_face, 
                      li, 
                      path_vector,
                      side_face_index.Array() + side_face_index_loop_mark[fli] ) )
          {
            ON_BrepLoop& top_loop = brep.m_L[brep.m_L.Count()-1];
            top_loop.m_type = brep.m_L[li].m_type;
          }
        }
      }
    }

    if ( brep.m_F[face_index].m_bRev )
    {
      for ( int fi = face_count0; fi < brep.m_F.Count(); fi++ )
      {
        brep.FlipFace(brep.m_F[fi]);
      }
    }
  }

  return rc;
}